

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem1.cpp
# Opt level: O2

bool isPowerOfTwo(longlong x)

{
  __type _Var1;
  double dVar2;
  double dVar3;
  
  if (x != 0) {
    _Var1 = std::log2<long_long>(x);
    dVar2 = ceil(_Var1);
    _Var1 = std::log2<long_long>(x);
    dVar3 = floor(_Var1);
    return (bool)(-(dVar3 == dVar2) & 1);
  }
  return false;
}

Assistant:

bool isPowerOfTwo(ll x){ if(x==0) return false; return (ceil(log2(x)) == floor(log2(x))); }